

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_strategy.h
# Opt level: O2

void __thiscall
charls::encoder_strategy::append_to_bit_stream
          (encoder_strategy *this,uint32_t bits,int32_t bit_count)

{
  decoder_strategy *this_00;
  uint __line;
  uint32_t uVar1;
  int iVar2;
  char *__assertion;
  
  if ((uint)bit_count < 0x20) {
    this_00 = (this->decoder_)._M_t.
              super___uniq_ptr_impl<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>_>
              ._M_t.
              super__Tuple_impl<0UL,_charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>
              .super__Head_base<0UL,_charls::decoder_strategy_*,_false>._M_head_impl;
    if ((bit_count == 0 && bits == 0 || this_00 == (decoder_strategy *)0x0) ||
       (uVar1 = decoder_strategy::read_long_value(this_00,bit_count), uVar1 == bits)) {
      if (bits >> ((byte)bit_count & 0x1f) == 0) {
        iVar2 = this->free_bit_count_ - bit_count;
        this->free_bit_count_ = iVar2;
        if (iVar2 < 0) {
          this->bit_buffer_ = this->bit_buffer_ | bits >> (-(char)iVar2 & 0x1fU);
          flush(this);
          iVar2 = this->free_bit_count_;
          if (iVar2 < 0) {
            this->bit_buffer_ = this->bit_buffer_ | bits >> (-(char)iVar2 & 0x1fU);
            flush(this);
            iVar2 = this->free_bit_count_;
            if (iVar2 < 0) {
              __assertion = "free_bit_count_ >= 0";
              __line = 0x4a;
              goto LAB_0011e3d4;
            }
          }
        }
        this->bit_buffer_ = this->bit_buffer_ | bits << ((byte)iVar2 & 0x1f);
        return;
      }
      __assertion = "(bits | mask) == mask";
      __line = 0x35;
    }
    else {
      __assertion = 
      "(!decoder_) || (bit_count == 0 && bits == 0) || (static_cast<uint32_t>(decoder_->read_long_value(bit_count)) == bits)"
      ;
      __line = 0x32;
    }
  }
  else {
    __assertion = "bit_count < 32 && bit_count >= 0";
    __line = 0x30;
  }
LAB_0011e3d4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/encoder_strategy.h"
                ,__line,
                "void charls::encoder_strategy::append_to_bit_stream(const uint32_t, const int32_t)"
               );
}

Assistant:

void append_to_bit_stream(const uint32_t bits, const int32_t bit_count)
    {
        ASSERT(bit_count < 32 && bit_count >= 0);
        ASSERT((!decoder_) || (bit_count == 0 && bits == 0) ||
               (static_cast<uint32_t>(decoder_->read_long_value(bit_count)) == bits));
#ifndef NDEBUG
        const uint32_t mask{(1U << bit_count) - 1U};
        ASSERT((bits | mask) == mask); // Not used bits must be set to zero.
#endif

        free_bit_count_ -= bit_count;
        if (free_bit_count_ >= 0)
        {
            bit_buffer_ |= bits << free_bit_count_;
        }
        else
        {
            // Add as much bits in the remaining space as possible and flush.
            bit_buffer_ |= bits >> -free_bit_count_;
            flush();

            // A second flush may be required if extra marker detect bits were needed and not all bits could be written.
            if (free_bit_count_ < 0)
            {
                bit_buffer_ |= bits >> -free_bit_count_;
                flush();
            }

            ASSERT(free_bit_count_ >= 0);
            bit_buffer_ |= bits << free_bit_count_;
        }
    }